

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_paddl_u16_aarch64(uint64_t a,uint64_t b)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t tmp2;
  uint64_t tmp;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar1 = (a >> 0x10 & 0xffff0000ffff) + (a & 0xffff0000ffff);
  uVar2 = (b & 0xffff0000ffff) * 0x10000 + (b & 0xffff0000ffff0000);
  return uVar1 & 0xffff | uVar1 >> 0x10 & 0xffff0000 | (uVar2 & 0xffff0000) << 0x10 |
         uVar2 & 0xffff000000000000;
}

Assistant:

uint64_t HELPER(neon_paddl_u16)(uint64_t a, uint64_t b)
{
    uint64_t tmp;
    uint64_t tmp2;

    tmp = a & 0x0000ffff0000ffffull;
    tmp += (a >> 16) & 0x0000ffff0000ffffull;
    tmp2 = b & 0xffff0000ffff0000ull;
    tmp2 += (b << 16) & 0xffff0000ffff0000ull;
    return    ( tmp         & 0xffff)
            | ((tmp  >> 16) & 0xffff0000ull)
            | ((tmp2 << 16) & 0xffff00000000ull)
            | ( tmp2        & 0xffff000000000000ull);
}